

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O0

void depspawn::internal::start_master(void)

{
  __pointer_type in_RAX;
  long *in_FS_OFFSET;
  undefined4 unaff_retaddr;
  __int_type_conflict unaff_retaddr_00;
  __atomic_base<int> *in_stack_00000008;
  TaskPool *in_stack_00000018;
  
  std::atomic<depspawn::internal::Workitem_*>::operator=
            ((atomic<depspawn::internal::Workitem_*> *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             in_RAX);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(unaff_retaddr_00,unaff_retaddr),SUB81((ulong)in_RAX >> 0x38,0)
            );
  std::__atomic_base<int>::operator=(in_stack_00000008,unaff_retaddr_00);
  *(undefined8 *)(*in_FS_OFFSET + -8) = 0;
  if (TP == 0) {
    get_task_pool();
  }
  else {
    TaskPool::launch_threads(in_stack_00000018);
  }
  return;
}

Assistant:

void start_master()
    {
      worklist = nullptr;
      eraser_assigned = false;
      ObserversAtWork = 0;
      enum_thr_spec_father = nullptr;

#ifdef DEPSPAWN_USE_TBB
      master_task = new (tbb::task::allocate_root()) tbb::empty_task;
      master_task->set_ref_count(1);
#else
      if (TP == nullptr) {
        get_task_pool();
      } else {
        assert(!TP->is_running());
        TP->launch_threads();
      }
#endif
    }